

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError parse_args(GlobalConfig *global,int argc,char **argv)

{
  int iVar1;
  OperationConfig *pOVar2;
  char *pcVar3;
  char *reason;
  char *pcStack_58;
  _Bool used;
  char *nextarg;
  OperationConfig *pOStack_48;
  _Bool passarg;
  OperationConfig *config;
  char *pcStack_38;
  ParameterError result;
  char *orig_opt;
  _Bool stillflags;
  char **ppcStack_28;
  int i;
  char **argv_local;
  GlobalConfig *pGStack_18;
  int argc_local;
  GlobalConfig *global_local;
  
  pcStack_38 = (char *)0x0;
  config._4_4_ = PARAM_OK;
  pOStack_48 = global->first;
  orig_opt._4_4_ = 1;
  orig_opt._3_1_ = 1;
  ppcStack_28 = argv;
  argv_local._4_4_ = argc;
  pGStack_18 = global;
  while( true ) {
    if (argv_local._4_4_ <= orig_opt._4_4_ || config._4_4_ != PARAM_OK) {
      if (((config._4_4_ == PARAM_OK) && ((*(uint *)&pOStack_48->field_0x4ec & 1) != 0)) &&
         ((*(ulong *)&pOStack_48->field_0x4e4 >> 5 & 1) != 0)) {
        config._4_4_ = PARAM_CONTDISP_RESUME_FROM;
      }
      if ((((config._4_4_ != PARAM_OK) && (config._4_4_ != PARAM_HELP_REQUESTED)) &&
          ((config._4_4_ != PARAM_MANUAL_REQUESTED &&
           ((config._4_4_ != PARAM_VERSION_INFO_REQUESTED &&
            (config._4_4_ != PARAM_ENGINES_REQUESTED)))))) &&
         (config._4_4_ != PARAM_CA_EMBED_REQUESTED)) {
        pcVar3 = param2text(config._4_4_);
        if ((pcStack_38 == (char *)0x0) || (iVar1 = strcmp(":",pcStack_38), iVar1 == 0)) {
          helpf(tool_stderr,"%s",pcVar3);
        }
        else {
          helpf(tool_stderr,"option %s: %s",pcStack_38,pcVar3);
        }
      }
      return config._4_4_;
    }
    pcStack_38 = ppcStack_28[orig_opt._4_4_];
    if (pcStack_38 == (char *)0x0) break;
    if (((orig_opt._3_1_ & 1) == 0) || (*pcStack_38 != '-')) {
      config._4_4_ = getparameter("--url",pcStack_38,(char *)0x0,(char *)0x0,
                                  (_Bool *)((long)&reason + 7),pGStack_18,pOStack_48);
    }
    else {
      iVar1 = strcmp("--",pcStack_38);
      if (iVar1 == 0) {
        orig_opt._3_1_ = 0;
      }
      else {
        pcStack_58 = (char *)0x0;
        if ((orig_opt._4_4_ < argv_local._4_4_ + -1) &&
           (pcStack_58 = ppcStack_28[orig_opt._4_4_ + 1], pcStack_58 == (char *)0x0)) {
          return PARAM_NO_MEM;
        }
        config._4_4_ = getparameter(pcStack_38,pcStack_58,ppcStack_28[orig_opt._4_4_],
                                    ppcStack_28[orig_opt._4_4_ + 1],(_Bool *)((long)&nextarg + 7),
                                    pGStack_18,pOStack_48);
        pOStack_48 = pGStack_18->last;
        if (config._4_4_ == PARAM_NEXT_OPERATION) {
          config._4_4_ = PARAM_OK;
          if ((pOStack_48->url_list == (getout *)0x0) || (pOStack_48->url_list->url == (char *)0x0))
          {
            errorf(pGStack_18,"missing URL before --next");
            config._4_4_ = PARAM_BAD_USE;
          }
          else {
            pOVar2 = (OperationConfig *)malloc(0x4f0);
            pOStack_48->next = pOVar2;
            if (pOStack_48->next == (OperationConfig *)0x0) {
              config._4_4_ = PARAM_NO_MEM;
            }
            else {
              config_init(pOStack_48->next);
              pOStack_48->next->global = pGStack_18;
              pGStack_18->last = pOStack_48->next;
              pOStack_48->next->prev = pOStack_48;
              pOStack_48 = pOStack_48->next;
            }
          }
        }
        else if ((config._4_4_ == PARAM_OK) && ((nextarg._7_1_ & 1) != 0)) {
          orig_opt._4_4_ = orig_opt._4_4_ + 1;
        }
      }
    }
    orig_opt._4_4_ = orig_opt._4_4_ + 1;
  }
  return PARAM_NO_MEM;
}

Assistant:

ParameterError parse_args(struct GlobalConfig *global, int argc,
                          argv_item_t argv[])
{
  int i;
  bool stillflags;
  const char *orig_opt = NULL;
  ParameterError result = PARAM_OK;
  struct OperationConfig *config = global->first;

  for(i = 1, stillflags = TRUE; i < argc && !result; i++) {
    orig_opt = convert_tchar_to_UTF8(argv[i]);
    if(!orig_opt)
      return PARAM_NO_MEM;

    if(stillflags && ('-' == orig_opt[0])) {
      bool passarg;

      if(!strcmp("--", orig_opt))
        /* This indicates the end of the flags and thus enables the
           following (URL) argument to start with -. */
        stillflags = FALSE;
      else {
        const char *nextarg = NULL;
        if(i < (argc - 1)) {
          nextarg = convert_tchar_to_UTF8(argv[i + 1]);
          if(!nextarg) {
            unicodefree(orig_opt);
            return PARAM_NO_MEM;
          }
        }

        result = getparameter(orig_opt, nextarg, argv[i], argv[i + 1],
                              &passarg, global, config);

        unicodefree(nextarg);
        config = global->last;
        if(result == PARAM_NEXT_OPERATION) {
          /* Reset result as PARAM_NEXT_OPERATION is only used here and not
             returned from this function */
          result = PARAM_OK;

          if(config->url_list && config->url_list->url) {
            /* Allocate the next config */
            config->next = malloc(sizeof(struct OperationConfig));
            if(config->next) {
              /* Initialise the newly created config */
              config_init(config->next);

              /* Set the global config pointer */
              config->next->global = global;

              /* Update the last config pointer */
              global->last = config->next;

              /* Move onto the new config */
              config->next->prev = config;
              config = config->next;
            }
            else
              result = PARAM_NO_MEM;
          }
          else {
            errorf(global, "missing URL before --next");
            result = PARAM_BAD_USE;
          }
        }
        else if(!result && passarg)
          i++; /* we are supposed to skip this */
      }
    }
    else {
      bool used;

      /* Just add the URL please */
      result = getparameter("--url", orig_opt, NULL, NULL,
                            &used, global, config);
    }

    if(!result)
      unicodefree(orig_opt);
  }

  if(!result && config->content_disposition) {
    if(config->resume_from_current)
      result = PARAM_CONTDISP_RESUME_FROM;
  }

  if(result && result != PARAM_HELP_REQUESTED &&
     result != PARAM_MANUAL_REQUESTED &&
     result != PARAM_VERSION_INFO_REQUESTED &&
     result != PARAM_ENGINES_REQUESTED &&
     result != PARAM_CA_EMBED_REQUESTED) {
    const char *reason = param2text(result);

    if(orig_opt && strcmp(":", orig_opt))
      helpf(tool_stderr, "option %s: %s", orig_opt, reason);
    else
      helpf(tool_stderr, "%s", reason);
  }

  unicodefree(orig_opt);
  return result;
}